

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptStringObject::GetItemQuery
          (JavascriptStringObject *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  BOOL BVar1;
  JavascriptString *pJVar2;
  ScriptContext *objectScriptContext;
  Var aValue;
  JavascriptString *str;
  Var strObject;
  ScriptContext *requestContext_local;
  Var *value_local;
  uint32 index_local;
  Var originalInstance_local;
  JavascriptStringObject *this_local;
  
  pJVar2 = InternalUnwrap(this);
  objectScriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  aValue = CrossSite::MarshalVar(requestContext,pJVar2,objectScriptContext);
  pJVar2 = VarTo<Js::JavascriptString>(aValue);
  BVar1 = JavascriptString::GetItemAt(pJVar2,index,value);
  if (BVar1 == 0) {
    this_local._4_4_ =
         DynamicObject::GetItemQuery
                   (&this->super_DynamicObject,originalInstance,index,value,requestContext);
  }
  else {
    this_local._4_4_ = Property_Found;
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags JavascriptStringObject::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
        Var strObject = CrossSite::MarshalVar(requestContext,
          this->InternalUnwrap(), this->GetScriptContext());

        JavascriptString* str = VarTo<JavascriptString>(strObject);
        if (str->GetItemAt(index, value))
        {
            return PropertyQueryFlags::Property_Found;
        }
        return DynamicObject::GetItemQuery(originalInstance, index, value, requestContext);
    }